

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O2

void __thiscall
cs_impl::
cni_holder<std::_Deque_iterator<cs_impl::any,_cs_impl::any_&,_cs_impl::any_*>_(*)(std::_Deque_iterator<cs_impl::any,_cs_impl::any_&,_cs_impl::any_*>_&),_std::_Deque_iterator<cs_impl::any,_cs_impl::any_&,_cs_impl::any_*>_(*)(std::_Deque_iterator<cs_impl::any,_cs_impl::any_&,_cs_impl::any_*>_&)>
::cni_holder(cni_holder<std::_Deque_iterator<cs_impl::any,_cs_impl::any_&,_cs_impl::any_*>_(*)(std::_Deque_iterator<cs_impl::any,_cs_impl::any_&,_cs_impl::any_*>_&),_std::_Deque_iterator<cs_impl::any,_cs_impl::any_&,_cs_impl::any_*>_(*)(std::_Deque_iterator<cs_impl::any,_cs_impl::any_&,_cs_impl::any_*>_&)>
             *this,_func__Deque_iterator<cs_impl::any,_cs_impl::any_&,_cs_impl::any_ptr>__Deque_iterator<cs_impl::any,_cs_impl::any_&,_cs_impl::any_ptr>_ptr
                   **func)

{
  _Any_data local_28;
  code *local_18;
  code *pcStack_10;
  
  (this->super_cni_holder_base)._vptr_cni_holder_base = (_func_int **)&PTR__cni_holder_0023dac0;
  local_18 = (code *)0x0;
  pcStack_10 = (code *)0x0;
  local_28._M_unused._M_object =
       (_func__Deque_iterator<cs_impl::any,_cs_impl::any_&,_cs_impl::any_ptr>__Deque_iterator<cs_impl::any,_cs_impl::any_&,_cs_impl::any_ptr>_ptr
        *)0x0;
  local_28._8_8_ = 0;
  if (*func != (_func__Deque_iterator<cs_impl::any,_cs_impl::any_&,_cs_impl::any_ptr>__Deque_iterator<cs_impl::any,_cs_impl::any_&,_cs_impl::any_ptr>_ptr
                *)0x0) {
    pcStack_10 = std::
                 _Function_handler<std::_Deque_iterator<cs_impl::any,_cs_impl::any_&,_cs_impl::any_*>_(std::_Deque_iterator<cs_impl::any,_cs_impl::any_&,_cs_impl::any_*>_&),_std::_Deque_iterator<cs_impl::any,_cs_impl::any_&,_cs_impl::any_*>_(*)(std::_Deque_iterator<cs_impl::any,_cs_impl::any_&,_cs_impl::any_*>_&)>
                 ::_M_invoke;
    local_18 = std::
               _Function_handler<std::_Deque_iterator<cs_impl::any,_cs_impl::any_&,_cs_impl::any_*>_(std::_Deque_iterator<cs_impl::any,_cs_impl::any_&,_cs_impl::any_*>_&),_std::_Deque_iterator<cs_impl::any,_cs_impl::any_&,_cs_impl::any_*>_(*)(std::_Deque_iterator<cs_impl::any,_cs_impl::any_&,_cs_impl::any_*>_&)>
               ::_M_manager;
    local_28._M_unused._0_8_ = (undefined8)*func;
  }
  std::
  function<std::_Deque_iterator<cs_impl::any,_cs_impl::any_&,_cs_impl::any_*>_(std::_Deque_iterator<cs_impl::any,_cs_impl::any_&,_cs_impl::any_*>_&)>
  ::function(&(this->mCni).mFunc,
             (function<std::_Deque_iterator<cs_impl::any,_cs_impl::any_&,_cs_impl::any_*>_(std::_Deque_iterator<cs_impl::any,_cs_impl::any_&,_cs_impl::any_*>_&)>
              *)&local_28);
  std::_Function_base::~_Function_base((_Function_base *)&local_28);
  return;
}

Assistant:

explicit cni_holder(const T &func) : mCni(func) {}